

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

void __thiscall sqvector<SQVM::CallInfo>::~sqvector(sqvector<SQVM::CallInfo> *this)

{
  SQUnsignedInteger in_RDI;
  SQUnsignedInteger i;
  void *p;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    for (p = (void *)0x0; p < *(void **)(in_RDI + 8); p = (void *)((long)p + 1)) {
      SQVM::CallInfo::~CallInfo((CallInfo *)0x144436);
    }
    sq_vm_free(p,in_RDI);
  }
  return;
}

Assistant:

~sqvector()
    {
        if(_allocated) {
            for(SQUnsignedInteger i = 0; i < _size; i++)
                _vals[i].~T();
            SQ_FREE(_vals, (_allocated * sizeof(T)));
        }
    }